

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar2 = accept(this,__fd,(sockaddr *)&e,__addr_len);
  iVar1 = e._M_value;
  if (e._M_value == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = iVar1;
  eVar3._M_cat = e._M_cat;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void acceptor::accept(stream_socket &target)
{
	system::error_code e;
	accept(target,e);
	if(e)
		throw system::system_error(e);
}